

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void glist_sort(_glist *x)

{
  bool bVar1;
  t_gobj *ptVar2;
  t_float tVar3;
  t_gobj *ptStack_28;
  t_float x1;
  t_gobj *g;
  t_float lastx;
  int foo;
  int nitems;
  _glist *x_local;
  
  lastx = 0.0;
  bVar1 = false;
  g._4_4_ = -1e+37;
  for (ptStack_28 = x->gl_list; ptStack_28 != (t_gobj *)0x0; ptStack_28 = ptStack_28->g_next) {
    tVar3 = gobj_getxforsort(ptStack_28);
    if (tVar3 < g._4_4_) {
      bVar1 = true;
    }
    lastx = (t_float)((int)lastx + 1);
    g._4_4_ = tVar3;
  }
  if (bVar1) {
    ptVar2 = glist_dosort(x,x->gl_list,(int)lastx);
    x->gl_list = ptVar2;
  }
  return;
}

Assistant:

void glist_sort(t_glist *x)
{
    int nitems = 0, foo = 0;
    t_float lastx = -1e37;
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_float x1 = gobj_getxforsort(g);
        if (x1 < lastx)
            foo = 1;
        lastx = x1;
        nitems++;
    }
    if (foo)
        x->gl_list = glist_dosort(x, x->gl_list, nitems);
}